

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_msl_shader_input(CompilerMSL *this,MSLShaderInterfaceVariable *si)

{
  uint32_t uVar1;
  BuiltIn BVar2;
  MSLShaderVariableRate MVar3;
  MSLShaderInterfaceVariable *pMVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  bool bVar8;
  BuiltIn local_28;
  BuiltIn local_24;
  key_type local_20;
  MSLShaderInterfaceVariable *local_18;
  MSLShaderInterfaceVariable *si_local;
  CompilerMSL *this_local;
  
  local_20.location = si->location;
  local_20.component = si->component;
  local_18 = si;
  si_local = (MSLShaderInterfaceVariable *)this;
  pmVar5 = ::std::
           map<spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable,_std::less<spirv_cross::LocationComponentPair>,_std::allocator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>_>
           ::operator[](&this->inputs_by_location,&local_20);
  uVar1 = si->component;
  pmVar5->location = si->location;
  pmVar5->component = uVar1;
  BVar2 = si->builtin;
  pmVar5->format = si->format;
  pmVar5->builtin = BVar2;
  MVar3 = si->rate;
  pmVar5->vecsize = si->vecsize;
  pmVar5->rate = MVar3;
  bVar8 = false;
  if (local_18->builtin != BuiltInMax) {
    local_24 = local_18->builtin;
    sVar6 = ::std::
            unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
            ::count(&this->inputs_by_builtin,&local_24);
    bVar8 = sVar6 == 0;
  }
  pMVar4 = local_18;
  if (bVar8) {
    local_28 = local_18->builtin;
    pmVar7 = ::std::
             unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
             ::operator[](&this->inputs_by_builtin,&local_28);
    uVar1 = pMVar4->component;
    pmVar7->location = pMVar4->location;
    pmVar7->component = uVar1;
    BVar2 = pMVar4->builtin;
    pmVar7->format = pMVar4->format;
    pmVar7->builtin = BVar2;
    MVar3 = pMVar4->rate;
    pmVar7->vecsize = pMVar4->vecsize;
    pmVar7->rate = MVar3;
  }
  return;
}

Assistant:

void CompilerMSL::add_msl_shader_input(const MSLShaderInterfaceVariable &si)
{
	inputs_by_location[{si.location, si.component}] = si;
	if (si.builtin != BuiltInMax && !inputs_by_builtin.count(si.builtin))
		inputs_by_builtin[si.builtin] = si;
}